

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void sort_actions(void)

{
  int iVar1;
  Yshort *pYVar2;
  Yshort *pYVar3;
  Yshort *pYVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar13;
  long lVar12;
  
  pYVar4 = (Yshort *)allocate(nvectors << 2);
  pYVar3 = width;
  pYVar2 = tally;
  nentries = 0;
  uVar9 = 0;
  uVar5 = (ulong)(uint)nvectors;
  if (nvectors < 1) {
    uVar5 = uVar9;
  }
  uVar10 = 0;
  order = pYVar4;
  do {
    if (uVar9 == uVar5) {
      return;
    }
    iVar1 = pYVar2[uVar9];
    if (0 < iVar1) {
      uVar13 = (ulong)uVar10;
      uVar7 = (ulong)uVar10;
      do {
        uVar13 = uVar13 - 1;
        if ((int)uVar7 < 1) {
          uVar7 = (ulong)(((int)uVar10 >> 0x1f & uVar10) - 1);
          break;
        }
        uVar7 = (ulong)((int)uVar7 - 1);
      } while (pYVar3[pYVar4[uVar13 & 0xffffffff]] < pYVar3[uVar9]);
      uVar13 = 0xffffffff;
      if ((int)uVar7 < -1) {
        uVar13 = uVar7;
      }
      while( true ) {
        iVar6 = (int)uVar7;
        iVar8 = (int)uVar13;
        if (((iVar6 < 0) || (iVar8 = iVar6, pYVar3[pYVar4[uVar7]] != pYVar3[uVar9])) ||
           (iVar1 <= pYVar2[pYVar4[uVar7]])) break;
        uVar7 = (ulong)(iVar6 - 1);
      }
      lVar12 = (long)(int)uVar10;
      while (lVar11 = lVar12 + -1, iVar8 < lVar11) {
        pYVar4[lVar12] = pYVar4[lVar11];
        lVar12 = lVar11;
      }
      pYVar4[(long)iVar8 + 1] = (Yshort)uVar9;
      uVar10 = uVar10 + 1;
      nentries = uVar10;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void sort_actions()
{
  register int i;
  register int j;
  register int k;
  register int t;
  register int w;

  order = NEW2(nvectors, Yshort);
  nentries = 0;

  for (i = 0; i < nvectors; i++)
    {
      if (tally[i] > 0)
	{
	  t = tally[i];
	  w = width[i];
	  j = nentries - 1;

	  while (j >= 0 && (width[order[j]] < w))
	    j--;

	  while (j >= 0 && (width[order[j]] == w) && (tally[order[j]] < t))
	    j--;

	  for (k = nentries - 1; k > j; k--)
	    order[k + 1] = order[k];

	  order[j + 1] = i;
	  nentries++;
	}
    }
}